

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

void WriteAllBoardsTest(BasePort *port,vector<AmpIO_*,_std::allocator<AmpIO_*>_> *boardList)

{
  pointer ppAVar1;
  AmpIO *this;
  ostream *poVar2;
  int axis;
  uint index;
  uint uVar3;
  ulong uVar4;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Protocol: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,port->Protocol_);
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar3 = 0;
  while( true ) {
    uVar4 = (ulong)uVar3;
    ppAVar1 = (boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppAVar1 >> 3) <= uVar4) break;
    AmpIO::WritePowerEnable(ppAVar1[uVar4],true);
    AmpIO::SetAmpEnableMask
              ((boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar4],0xf,0xf);
    AmpIO::SetSafetyRelay
              ((boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar4],true);
    for (index = 0; index != 4; index = index + 1) {
      this = (boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar4];
      AmpIO::SetMotorCurrent
                (this,index,index + (uint)(this->super_FpgaIO).super_BoardIO.BoardId * 0x10 + 0x8000
                );
    }
    uVar3 = uVar3 + 1;
  }
  (*port->_vptr_BasePort[0x21])(port);
  return;
}

Assistant:

void  WriteAllBoardsTest(BasePort *port, std::vector<AmpIO *> &boardList)
{
    std::cout << "Protocol: " << port->GetProtocol() << std::endl;
    for (unsigned int j = 0; j < boardList.size(); j++) {
        boardList[j]->WritePowerEnable(true);
        boardList[j]->SetAmpEnableMask(0x0f, 0x0f);
        boardList[j]->SetSafetyRelay(true);
        for (int axis = 0; axis < 4; axis++)
            boardList[j]->SetMotorCurrent(axis, 0x8000+16*boardList[j]->GetBoardId()+axis);
    }
    port->WriteAllBoards();
}